

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

int Ses_ManCreateTruthTableClause(Ses_Man_t *pSes,int t)

{
  Vec_Int_t *p;
  byte bVar1;
  int iVar2;
  long lVar3;
  int j;
  int iVar4;
  int iVar5;
  int k;
  long lVar6;
  int pLits [3];
  
  lVar3 = (long)(t + 1 >> 6);
  bVar1 = (byte)(t + 1);
  iVar5 = 0;
  do {
    if (pSes->nGates <= iVar5) {
      if (pSes->nSpecFunc == 1) {
        p = pSes->vAssump;
        iVar5 = Ses_ManSimVar(pSes,pSes->nGates + -1,t);
        iVar5 = Abc_Var2Lit(iVar5,~(uint)(pSes->pSpec[lVar3] >> (bVar1 & 0x3f)) & 1);
        Vec_IntPush(p,iVar5);
      }
      return 1;
    }
    iVar4 = pSes->nSpecVars;
    iVar2 = 0;
    while (j = iVar2, j < iVar4 + iVar5) {
      for (k = j + 1; iVar2 = j + 1, k < iVar4 + iVar5; k = k + 1) {
        Ses_ManCreateMainClause(pSes,t,iVar5,j,k,0,0,1);
        Ses_ManCreateMainClause(pSes,t,iVar5,j,k,0,1,0);
        Ses_ManCreateMainClause(pSes,t,iVar5,j,k,0,1,1);
        Ses_ManCreateMainClause(pSes,t,iVar5,j,k,1,0,0);
        Ses_ManCreateMainClause(pSes,t,iVar5,j,k,1,0,1);
        Ses_ManCreateMainClause(pSes,t,iVar5,j,k,1,1,0);
        Ses_ManCreateMainClause(pSes,t,iVar5,j,k,1,1,1);
        iVar4 = pSes->nSpecVars;
      }
    }
    if (pSes->nSpecFunc != 1) {
      iVar4 = 0;
      lVar6 = 0;
      while (lVar6 < pSes->nSpecFunc) {
        iVar2 = Ses_ManOutputVar(pSes,(int)lVar6,iVar5);
        pLits[0] = Abc_Var2Lit(iVar2,1);
        iVar2 = Ses_ManSimVar(pSes,iVar5,t);
        pLits[1] = Abc_Var2Lit(iVar2,~(uint)(pSes->pSpec[iVar4 + lVar3] >> (bVar1 & 0x3f)) & 1);
        iVar2 = sat_solver_addclause(pSes->pSat,pLits,pLits + 2);
        lVar6 = lVar6 + 1;
        iVar4 = iVar4 + 4;
        if (iVar2 == 0) {
          return 0;
        }
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

static int inline Ses_ManCreateTruthTableClause( Ses_Man_t * pSes, int t )
{
    int i, j, k, h;
    int pLits[3];

    for ( i = 0; i < pSes->nGates; ++i )
    {
        /* main clauses */
        for ( j = 0; j < pSes->nSpecVars + i; ++j )
            for ( k = j + 1; k < pSes->nSpecVars + i; ++k )
            {
                Ses_ManCreateMainClause( pSes, t, i, j, k, 0, 0, 1 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 0, 1, 0 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 0, 1, 1 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 1, 0, 0 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 1, 0, 1 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 1, 1, 0 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 1, 1, 1 );
            }

        /* output clauses */
        if ( pSes->nSpecFunc != 1 )
            for ( h = 0; h < pSes->nSpecFunc; ++h )
            {
                pLits[0] = Abc_Var2Lit( Ses_ManOutputVar( pSes, h, i ), 1 );
                pLits[1] = Abc_Var2Lit( Ses_ManSimVar( pSes, i, t ), 1 - Abc_TtGetBit( &pSes->pSpec[h << 2], t + 1 ) );
                if ( !sat_solver_addclause( pSes->pSat, pLits, pLits + 2 ) )
                    return 0;
            }
    }

    if ( pSes->nSpecFunc == 1 )
        Vec_IntPush( pSes->vAssump, Abc_Var2Lit( Ses_ManSimVar( pSes, pSes->nGates - 1, t ), 1 - Abc_TtGetBit( pSes->pSpec, t + 1 ) ) );

    return 1;
}